

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HCrash.cpp
# Opt level: O1

void __thiscall HCrash::ltssf_cz_c(HCrash *this,HModel *ptr_model)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  pointer pdVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  byte bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  this->model = ptr_model;
  iVar1 = ptr_model->objSense;
  pdVar3 = (ptr_model->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->cz_c_n = -1;
  this->n_eqv_c = 0;
  iVar13 = 3;
  if (this->alw_al_bs_cg != false) {
    iVar13 = -3;
  }
  this->pv_v = 0.0;
  lVar14 = (long)this->cz_r_n;
  piVar4 = (this->CrshARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar15 = (long)piVar4[lVar14];
  if (piVar4[lVar14] < piVar4[lVar14 + 1]) {
    piVar5 = (this->CrshARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->crsh_act_c).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->crsh_c_ty_pri_v).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->crsh_c_ty).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->crsh_c_k).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->CrshARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (this->crsh_mtx_c_mx_abs_v).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    iVar16 = -0x7fff;
    dVar18 = 1e+200;
    do {
      iVar2 = piVar5[lVar15];
      if ((piVar6[iVar2] != 0) &&
         (((this->alw_al_bs_cg != false || (iVar13 < piVar7[piVar8[iVar2]] + this->cz_r_pri_v)) &&
          (iVar12 = piVar7[piVar8[iVar2]] * this->crsh_fn_cf_pri_v -
                    piVar9[iVar2] * this->crsh_fn_cf_k, iVar16 <= iVar12)))) {
        bVar17 = this->no_ck_pv;
        if ((this->no_ck_pv & 1U) == 0) {
          dVar19 = ABS(pdVar10[lVar15]);
          dVar20 = pdVar11[iVar2] * 0.01;
          if (dVar19 <= 0.0001) {
            this->n_abs_pv_no_ok = this->n_abs_pv_no_ok + 1;
          }
          if (dVar19 <= dVar20) {
            this->n_rlv_pv_no_ok = this->n_rlv_pv_no_ok + 1;
          }
          bVar17 = 0.0001 < dVar19 && dVar20 < dVar19;
        }
        if ((bVar17 & 1) != 0) {
          if (iVar16 < iVar12) {
            this->cz_c_n = iVar2;
            this->pv_v = pdVar10[lVar15];
            this->n_eqv_c = 1;
            dVar18 = pdVar3[iVar2] * (double)iVar1;
            iVar16 = iVar12;
          }
          else if (iVar12 == iVar16) {
            if (((this->mn_co_tie_bk & 1U) != 0) &&
               (dVar19 = pdVar3[iVar2] * (double)iVar1, dVar19 < dVar18)) {
              this->cz_c_n = iVar2;
              this->pv_v = pdVar10[lVar15];
              this->n_eqv_c = 1;
              dVar18 = dVar19;
            }
            this->n_eqv_c = this->n_eqv_c + 1;
          }
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < piVar4[lVar14 + 1]);
  }
  return;
}

Assistant:

void HCrash::ltssf_cz_c(HModel *ptr_model) {
  model = ptr_model;
  //  matrix = model->getMatrix();
  const int objSense = model->getObjSense();
  const double *colCost = model->getcolCost();
  
  cz_c_n = no_ix;
  int su_r_c_pri_v_lm = crsh_mx_pri_v;
  //     Choose a column which has maximium priority function amongst those
  //     with entries in the selected row---making sure that the pivot is
  //     acceptable numerically.
  //
  //     Note
  //
  //     *  Numerical checking is switched off by setting the tolerances to
  //     .  zero.
  //
  //     *  Make sure that tl_crsh_rlv_pv_v < 1 otherwise test
  //     .  abs_c_v/crsh_mtx_c_mx_abs_v(c_n) .gt. tl_crsh_rlv_pv_v
  //     .  will never be satisfied
  
  if (alw_al_bs_cg)
    su_r_c_pri_v_lm = -crsh_mx_pri_v;
  else
    su_r_c_pri_v_lm = crsh_mx_pri_v;
  
  n_eqv_c = 0;
  pv_v = 0.0;
  double mn_co = HSOL_CONST_INF;
  int mx_c_pri_fn_v = -HSOL_CONST_I_INF;
  for (int el_n = CrshARstart[cz_r_n]; el_n < CrshARstart[cz_r_n + 1];
       el_n++) {
    int c_n = CrshARindex[el_n];
    if (crsh_act_c[c_n] == crsh_vr_st_no_act)
      continue;
    //     Don't allow the row to be replaced by a column whose priority to
    //     remain nonbasic is the same or greater.
    if (!alw_al_bs_cg
	&& (crsh_c_ty_pri_v[crsh_c_ty[c_n]] + cz_r_pri_v
	    <= su_r_c_pri_v_lm))
      continue;
    //			If column is worse than current best then break
    int c_pri_fn_v = crsh_fn_cf_pri_v * crsh_c_ty_pri_v[crsh_c_ty[c_n]]
      - crsh_fn_cf_k * crsh_c_k[c_n];
    if (c_pri_fn_v < mx_c_pri_fn_v)
      continue;
    //Pivot is OK if pivots are not being checked
    bool pv_ok = no_ck_pv;
    if (!no_ck_pv) {
      //     Check the matrix entry if it may be used as a pivot.
      double abs_c_v = abs(CrshARvalue[el_n]);
      bool abs_pv_v_ok = abs_c_v > tl_crsh_abs_pv_v;
      bool rlv_pv_v_ok = abs_c_v
	> tl_crsh_rlv_pv_v * crsh_mtx_c_mx_abs_v[c_n];
      if (!abs_pv_v_ok)
	n_abs_pv_no_ok += 1;
      if (!rlv_pv_v_ok)
	n_rlv_pv_no_ok += 1;
      pv_ok = abs_pv_v_ok && rlv_pv_v_ok;
    }
    //If the pivot is not OK then break
    if (!pv_ok)
      continue;
    //    Pivot is OK [or not being checked]
    if (c_pri_fn_v > mx_c_pri_fn_v) {
      //				Better column than best so far
      mx_c_pri_fn_v = c_pri_fn_v;
      cz_c_n = c_n;
      pv_v = CrshARvalue[el_n];
      n_eqv_c = 1;
      double sense_col_cost = objSense*colCost[c_n];
      mn_co = sense_col_cost;
    } else if (c_pri_fn_v == mx_c_pri_fn_v) {
      //				Matches the best column so far: possibly break tie on cost
      double sense_col_cost = objSense*colCost[c_n];
      if (mn_co_tie_bk && (sense_col_cost < mn_co)) {
	cz_c_n = c_n;
	pv_v = CrshARvalue[el_n];
	n_eqv_c = 1;
	mn_co = sense_col_cost;
      }
      n_eqv_c += 1;
    }
  }
}